

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseFrexp::test(ShaderBitfieldOperationCaseFrexp *this,Data *data)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  bVar1 = this->m_components < 1;
  if (0 < this->m_components) {
    lVar2 = 0;
    do {
      if ((data->inVec4[lVar2] != 0.0) || (NAN(data->inVec4[lVar2]))) {
        fVar5 = data->outVec4[lVar2];
        uVar3 = -(uint)(-fVar5 <= fVar5);
        fVar5 = (float)(~uVar3 & (uint)-fVar5 | (uint)fVar5 & uVar3);
        if (fVar5 < 0.5) {
          return bVar1;
        }
        if (1.0 <= fVar5) {
          return bVar1;
        }
      }
      else {
        if (data->outVec4[lVar2] != 0.0) {
          return bVar1;
        }
        if (NAN(data->outVec4[lVar2])) {
          return bVar1;
        }
        if (data->outIvec4[lVar2] != 0) {
          return bVar1;
        }
      }
      fVar5 = data->outVec4[lVar2];
      fVar4 = ldexpf(1.0,data->outIvec4[lVar2]);
      fVar5 = fVar4 * fVar5 - data->inVec4[lVar2];
      uVar3 = -(uint)(-fVar5 <= fVar5);
      if (0.0001 < (float)(~uVar3 & (uint)-fVar5 | (uint)fVar5 & uVar3)) {
        return bVar1;
      }
      lVar2 = lVar2 + 1;
      bVar1 = this->m_components <= lVar2;
    } while (lVar2 < this->m_components);
  }
  return bVar1;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			if (data->inVec4[i] == 0.0)
			{
				if (data->outVec4[i] != 0.0 || data->outIvec4[i] != 0)
				{
					return false;
				}
			}
			else if (deFloatAbs(data->outVec4[i]) < 0.5 || deFloatAbs(data->outVec4[i]) >= 1.0)
			{
				return false;
			}

			float result = data->outVec4[i] * deFloatPow(2.0, (float)data->outIvec4[i]);
			if (deFloatAbs(result - data->inVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}